

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

PackedSlice * __thiscall kratos::VarSlice::operator[](VarSlice *this,string *member_name)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  PackedSlice *pPVar4;
  long *plVar5;
  InternalException *this_00;
  UserException *pUVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  _Alloc_hider local_90;
  PackedStructFieldDef *def;
  undefined8 uStack_80;
  string local_68;
  undefined1 auStack_48 [8];
  shared_ptr<kratos::PackedSlice> p;
  
  if (this->parent_var == (Var *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_48,"Invalid var slice",(allocator<char> *)&local_68);
    InternalException::InternalException(this_00,(string *)auStack_48);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*(this->parent_var->super_IRNode)._vptr_IRNode[0x18])();
  if ((char)iVar2 != '\0') {
    uVar3 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])(this);
    if (uVar3 == (this->super_Var).var_width_) {
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0x29])(this);
      plVar5 = (long *)CONCAT44(extraout_var,iVar2);
      cVar1 = (**(code **)(*plVar5 + 0xb8))(plVar5);
      if (cVar1 == '\0') {
        pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
        (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&def,this);
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
        auStack_48 = (undefined1  [8])def;
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uStack_80;
        bVar7 = fmt::v7::to_string_view<char,_0>("Invalid member access{0}.{1}");
        format_str_00.data_ = (char *)bVar7.size_;
        format_str_00.size_ = 0xdd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_48;
        fmt::v7::detail::vformat_abi_cxx11_(&local_68,(detail *)bVar7.data_,format_str_00,args_00);
        UserException::UserException(pUVar6,&local_68);
        __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0x17])(this);
      if ((char)iVar2 != '\0') {
        pPVar4 = (PackedSlice *)__dynamic_cast(this,&typeinfo,&PackedSlice::typeinfo,0);
        pPVar4 = PackedSlice::slice_member(pPVar4,member_name);
        return pPVar4;
      }
      plVar5 = (long *)__dynamic_cast(plVar5,&Var::typeinfo,&PackedInterface::typeinfo,
                                      0xfffffffffffffffe);
      if (plVar5 == (long *)0x0) {
        pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
        (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&def,this);
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
        auStack_48 = (undefined1  [8])def;
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uStack_80;
        bVar7 = fmt::v7::to_string_view<char,_0>("Unable to access {0}.{1}");
        format_str_01.data_ = (char *)bVar7.size_;
        format_str_01.size_ = 0xdd;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_48;
        fmt::v7::detail::vformat_abi_cxx11_(&local_68,(detail *)bVar7.data_,format_str_01,args_01);
        UserException::UserException(pUVar6,&local_68);
        __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_90._M_p = (pointer)(**(code **)(*plVar5 + 8))(plVar5,member_name);
      if (local_90._M_p != (pointer)0x0) {
        local_68._M_dataplus._M_p = (pointer)this;
        std::
        make_shared<kratos::PackedSlice,kratos::VarSlice*,kratos::PackedStructFieldDef_const*&,std::__cxx11::string_const&>
                  ((VarSlice **)auStack_48,(PackedStructFieldDef **)&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff70);
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::PackedSlice>&>
                  ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)&(this->super_Var).slices_,(shared_ptr<kratos::PackedSlice> *)auStack_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
        return (PackedSlice *)auStack_48;
      }
      pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
      (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&def,this);
      p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
      auStack_48 = (undefined1  [8])def;
      p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uStack_80;
      bVar7 = fmt::v7::to_string_view<char,_0>("Unable to access {0}.{1}");
      format_str_02.data_ = (char *)bVar7.size_;
      format_str_02.size_ = 0xdd;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_48;
      fmt::v7::detail::vformat_abi_cxx11_(&local_68,(detail *)bVar7.data_,format_str_02,args_02);
      UserException::UserException(pUVar6,&local_68);
      __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&def,this);
  p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
  auStack_48 = (undefined1  [8])def;
  p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uStack_80;
  bVar7 = fmt::v7::to_string_view<char,_0>("Unable to access {0}.{1}");
  format_str.data_ = (char *)bVar7.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)auStack_48;
  fmt::v7::detail::vformat_abi_cxx11_(&local_68,(detail *)bVar7.data_,format_str,args);
  UserException::UserException(pUVar6,&local_68);
  __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PackedSlice &VarSlice::operator[](const std::string &member_name) {
    if (!parent_var) throw InternalException("Invalid var slice");
    if (!parent_var->is_packed() || width() != var_width())
        throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
    auto *root = get_var_root_parent();
    if (!root->is_struct())
        throw UserException(::format("Invalid member access{0}.{1}", to_string(), member_name));
    const PackedStructFieldDef *def;
    if (is_struct()) {
        auto *packed = dynamic_cast<PackedSlice *>(this);
        return packed->slice_member(member_name);
    } else {
        auto *packed = dynamic_cast<PackedInterface *>(root);
        if (!packed)
            throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
        def = packed->get_definition(member_name);
    }

    if (!def) throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
    auto p = std::make_shared<PackedSlice>(this, def, member_name);
    slices_.emplace_back(p);
    return *p;
}